

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS
VerifyJsonParsesAsListOfListsOfNumbers
          (_Bool IsJson5,char *Json,size_t *SubListLengthArray,size_t SubListLengthArrayCount)

{
  JL_STATUS JVar1;
  JL_DATA_TYPE JVar2;
  uint32_t uVar3;
  bool bVar4;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  uint64_t uStack_90;
  _Bool _result_9;
  uint64_t u64;
  size_t x;
  JlDataObject *object;
  JlListItem *subEnumerator;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  JlDataObject *pJStack_68;
  _Bool _result_5;
  size_t i;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  uint64_t uStack_58;
  _Bool _result;
  uint64_t counter;
  JlDataObject *subListObject;
  JlListItem *enumerator;
  size_t sStack_38;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *listObject;
  size_t SubListLengthArrayCount_local;
  size_t *SubListLengthArray_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_38 = 100;
  enumerator._4_4_ = WJTL_STATUS_SUCCESS;
  subListObject = (JlDataObject *)0x0;
  counter = 0;
  uStack_58 = 0;
  listObject = (JlDataObject *)SubListLengthArrayCount;
  SubListLengthArrayCount_local = (size_t)SubListLengthArray;
  SubListLengthArray_local = (size_t *)Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffc8);
  i._7_1_ = JVar1 == JL_STATUS_SUCCESS;
  WjTestLib_Assert((_Bool)i._7_1_,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x26f);
  if ((i._7_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  i._6_1_ = errorAtPos != 0;
  WjTestLib_Assert((_Bool)i._6_1_,"(listObject) != NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x270);
  if ((i._6_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlGetObjectType((JlDataObject *)errorAtPos);
  i._5_1_ = JVar2 == JL_DATA_TYPE_LIST;
  WjTestLib_Assert((_Bool)i._5_1_,"JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x271);
  if ((i._5_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  i._4_1_ = sStack_38 == 0;
  WjTestLib_Assert((_Bool)i._4_1_,"errorAtPos == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x272);
  if ((i._4_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  uVar3 = JlGetListCount((JlDataObject *)errorAtPos);
  i._3_1_ = (JlDataObject *)(ulong)uVar3 == listObject;
  WjTestLib_Assert((_Bool)i._3_1_,"JlGetListCount( listObject ) == SubListLengthArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x274);
  if ((i._3_1_ & 1) == 0) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  subListObject = (JlDataObject *)0x0;
  for (pJStack_68 = (JlDataObject *)0x0; pJStack_68 < listObject;
      pJStack_68 = (JlDataObject *)((long)&pJStack_68->Type + 1)) {
    counter = 0;
    JVar1 = JlGetObjectListNextItem
                      ((JlDataObject *)errorAtPos,(JlDataObject **)&counter,
                       (JlListItem **)&subListObject);
    subEnumerator._7_1_ = JVar1 == JL_STATUS_SUCCESS;
    WjTestLib_Assert((_Bool)subEnumerator._7_1_,
                     "((JL_STATUS)(JlGetObjectListNextItem( listObject, &subListObject, &enumerator ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27b);
    if ((subEnumerator._7_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    subEnumerator._6_1_ = counter != 0;
    WjTestLib_Assert((_Bool)subEnumerator._6_1_,"(subListObject) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27c);
    if ((subEnumerator._6_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar2 = JlGetObjectType((JlDataObject *)counter);
    subEnumerator._5_1_ = JVar2 == JL_DATA_TYPE_LIST;
    WjTestLib_Assert((_Bool)subEnumerator._5_1_,
                     "JlGetObjectType( subListObject ) == JL_DATA_TYPE_LIST",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27d);
    if ((subEnumerator._5_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    uVar3 = JlGetListCount((JlDataObject *)counter);
    subEnumerator._4_1_ =
         (ulong)uVar3 == *(ulong *)(SubListLengthArrayCount_local + (long)pJStack_68 * 8);
    WjTestLib_Assert((_Bool)subEnumerator._4_1_,
                     "JlGetListCount( subListObject ) == SubListLengthArray[i]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x27e);
    if ((subEnumerator._4_1_ & 1) == 0) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
    object = (JlDataObject *)0x0;
    x = 0;
    for (u64 = 0; u64 < *(ulong *)(SubListLengthArrayCount_local + (long)pJStack_68 * 8);
        u64 = u64 + 1) {
      uStack_90 = 0xffffffffffffffff;
      x = 0;
      JVar1 = JlGetObjectListNextItem
                        ((JlDataObject *)counter,(JlDataObject **)&x,(JlListItem **)&object);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectListNextItem( subListObject, &object, &subEnumerator ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x286);
      if (JVar1 != JL_STATUS_SUCCESS) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      bVar4 = x != 0;
      WjTestLib_Assert(bVar4,"(object) != NULL",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x287);
      if (!bVar4) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      JVar1 = JlGetObjectNumberU64((JlDataObject *)x,&stack0xffffffffffffff70);
      WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlGetObjectNumberU64( object, &u64 ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x288);
      if (JVar1 != JL_STATUS_SUCCESS) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
      uStack_58 = uStack_58 + 1;
      bVar4 = uStack_90 == uStack_58;
      WjTestLib_Assert(bVar4,"u64 == counter",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                       ,"VerifyJsonParsesAsListOfListsOfNumbers",0x28a);
      if (!bVar4) {
        enumerator._4_4_ = WJTL_STATUS_FAILED;
      }
    }
    JVar1 = JlGetObjectListNextItem
                      ((JlDataObject *)counter,(JlDataObject **)&x,(JlListItem **)&object);
    WjTestLib_Assert(JVar1 == JL_STATUS_END_OF_DATA,
                     "(JlGetObjectListNextItem( subListObject, &object, &subEnumerator )) == (JL_STATUS_END_OF_DATA)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsListOfListsOfNumbers",0x28e);
    if (JVar1 != JL_STATUS_END_OF_DATA) {
      enumerator._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  JVar1 = JlGetObjectListNextItem
                    ((JlDataObject *)errorAtPos,(JlDataObject **)&counter,
                     (JlListItem **)&subListObject);
  WjTestLib_Assert(JVar1 == JL_STATUS_END_OF_DATA,
                   "(JlGetObjectListNextItem( listObject, &subListObject, &enumerator )) == (JL_STATUS_END_OF_DATA)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x293);
  if (JVar1 != JL_STATUS_END_OF_DATA) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &listObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsListOfListsOfNumbers",0x296);
  if (JVar1 != JL_STATUS_SUCCESS) {
    enumerator._4_4_ = WJTL_STATUS_FAILED;
  }
  return enumerator._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsListOfListsOfNumbers
    (
        bool            IsJson5,
        char const*     Json,
        size_t*         SubListLengthArray,
        size_t          SubListLengthArrayCount
    )
{
    JlDataObject*   listObject = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    JlListItem*     enumerator = NULL;
    JlDataObject*   subListObject = NULL;
    uint64_t        counter = 0;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &listObject, &errorAtPos ) );
    JL_ASSERT_NOT_NULL( listObject );
    JL_ASSERT( JlGetObjectType( listObject ) == JL_DATA_TYPE_LIST );
    JL_ASSERT( errorAtPos == 0 );

    JL_ASSERT( JlGetListCount( listObject ) == SubListLengthArrayCount );

    // Verify all elements in list match array
    enumerator = NULL;
    for( size_t i=0; i<SubListLengthArrayCount; i++ )
    {
        subListObject = NULL;
        JL_ASSERT_SUCCESS( JlGetObjectListNextItem( listObject, &subListObject, &enumerator ) );
        JL_ASSERT_NOT_NULL( subListObject );
        JL_ASSERT( JlGetObjectType( subListObject ) == JL_DATA_TYPE_LIST );
        JL_ASSERT( JlGetListCount( subListObject ) == SubListLengthArray[i] );

        JlListItem*     subEnumerator = NULL;
        JlDataObject*   object = NULL;
        for( size_t x=0; x<SubListLengthArray[i]; x++ )
        {
            uint64_t u64 = UINT64_MAX;
            object = NULL;
            JL_ASSERT_SUCCESS( JlGetObjectListNextItem( subListObject, &object, &subEnumerator ) );
            JL_ASSERT_NOT_NULL( object );
            JL_ASSERT_SUCCESS( JlGetObjectNumberU64( object, &u64 ) );
            counter += 1;
            JL_ASSERT( u64 == counter );
        }

        // Verify there are no more items in the list
        JL_ASSERT_STATUS( JlGetObjectListNextItem( subListObject, &object, &subEnumerator ), JL_STATUS_END_OF_DATA );

    }

    // Verify there are no more items in the list
    JL_ASSERT_STATUS( JlGetObjectListNextItem( listObject, &subListObject, &enumerator ), JL_STATUS_END_OF_DATA );

    // Clean up
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &listObject ) );

    return TestReturn;
}